

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_interface.c
# Opt level: O0

EVdfg_stone EVdfg_create_stone(EVdfg dfg,char *action_spec)

{
  EVdfg_stone p_Var1;
  undefined8 in_RSI;
  char *in_RDI;
  CManager unaff_retaddr;
  CManager_conflict cm;
  EVdfg_stone ret;
  char *in_stack_00000028;
  EVdfg in_stack_00000030;
  int line;
  
  line = (int)((ulong)in_RSI >> 0x20);
  IntCManager_lock(unaff_retaddr,in_RDI,line);
  p_Var1 = INT_EVdfg_create_stone(in_stack_00000030,in_stack_00000028);
  IntCManager_unlock(unaff_retaddr,in_RDI,line);
  return p_Var1;
}

Assistant:

extern EVdfg_stone
EVdfg_create_stone ( EVdfg dfg, char *action_spec )
{
	EVdfg_stone ret;
	CManager cm = dfg->master->cm;
	CManager_lock(cm);
	ret = INT_EVdfg_create_stone(dfg, action_spec);
	CManager_unlock(cm);
	return ret;
}